

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70180c::SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_>::
SmallVectorReferenceInvalidationTest
          (SmallVectorReferenceInvalidationTest<slang::SmallVector<int,_3UL>_> *this)

{
  int iVar1;
  SmallVectorBase<int> *this_00;
  SmallVector<int,_3UL> *in_RDI;
  int e;
  int it;
  undefined4 local_c;
  
  SmallVectorTestBase::SmallVectorTestBase((SmallVectorTestBase *)0x91454f);
  slang::SmallVector<int,_3UL>::SmallVector((SmallVector<int,_3UL> *)0x914559);
  local_c = 0;
  this_00 = (SmallVectorBase<int> *)numBuiltinElts<int,_3UL>(in_RDI);
  iVar1 = (int)this_00;
  for (; local_c != iVar1; local_c = local_c + 1) {
    slang::SmallVectorBase<int>::emplace_back<int>(this_00,(int *)in_RDI);
  }
  return;
}

Assistant:

SmallVectorReferenceInvalidationTest() {
        // Fill up the small size so that insertions move the elements.
        for (int it = 0, e = numBuiltinElts(v); it != e; ++it)
            v.emplace_back(it + 1);
    }